

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

CompilerReflection * __thiscall
spirv_cross::CompilerReflection::to_member_name_abi_cxx11_
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Meta *pMVar1;
  Vector<Decoration> *this_00;
  size_t sVar2;
  ulong uVar3;
  Decoration *pDVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Vector<Decoration> *memb;
  Meta *type_meta;
  long lStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerReflection *this_local;
  
  lStack_20 = CONCAT44(in_register_00000014,index);
  type_meta._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  pMVar1 = ParsedIR::find_meta((ParsedIR *)&(type->super_IVariant).self,
                               (ID)*(uint32_t *)(lStack_20 + 8));
  if (pMVar1 == (Meta *)0x0) {
    join<char_const(&)[3],unsigned_int&>
              ((spirv_cross *)this,(char (*) [3])0x5febc1,(uint *)((long)&type_meta + 4));
  }
  else {
    this_00 = &pMVar1->members;
    uVar3 = (ulong)type_meta._4_4_;
    sVar2 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
    if (uVar3 < sVar2) {
      VectorView<spirv_cross::Meta::Decoration>::operator[]
                (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)type_meta._4_4_);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        pDVar4 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,
                            (ulong)type_meta._4_4_);
        ::std::__cxx11::string::string((string *)this,(string *)pDVar4);
        return this;
      }
    }
    join<char_const(&)[3],unsigned_int&>
              ((spirv_cross *)this,(char (*) [3])0x5febc1,(uint *)((long)&type_meta + 4));
  }
  return this;
}

Assistant:

string CompilerReflection::to_member_name(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &memb = type_meta->members;
		if (index < memb.size() && !memb[index].alias.empty())
			return memb[index].alias;
		else
			return join("_m", index);
	}
	else
		return join("_m", index);
}